

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_get_dimensions_instruction(Impl *impl,CallInst *instruction)

{
  uint uVar1;
  Instruction *pIVar2;
  mapped_type *pmVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  Id IVar7;
  Id IVar8;
  Builder *builder;
  Value *pVVar9;
  mapped_type *pmVar10;
  Operation *this;
  Operation *pOVar11;
  Operation *this_00;
  undefined7 extraout_var;
  Op op;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Id image_id;
  Id local_70;
  undefined4 local_6c;
  Operation *local_68;
  undefined1 local_5c [20];
  mapped_type *local_48;
  initializer_list<unsigned_int> local_40;
  
  bVar4 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar4) {
    return true;
  }
  builder = Converter::Impl::builder(impl);
  pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_70 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
  IVar7 = Converter::Impl::get_type_id(impl,local_70);
  pmVar10 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_70);
  local_40._M_array = (iterator)instruction;
  local_48 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_composite_meta,(key_type *)&local_40);
  local_5c._8_4_ = Argument;
  IVar8 = pmVar10->index_offset_id;
  local_5c._12_8_ = instruction;
  if (pmVar10->storage == StorageClassStorageBuffer) {
    IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
    if (IVar8 == 0) {
      this = Converter::Impl::allocate(impl,OpArrayLength,IVar7);
      Operation::add_id(this,local_70);
    }
    else {
      this = Converter::Impl::allocate(impl,OpCompositeExtract,IVar7);
      Operation::add_id(this,pmVar10->index_offset_id);
    }
    Operation::add_literal(this,(uint)(IVar8 != 0));
    bVar5 = pmVar10->component_type + I1;
    if ((0xb < bVar5) || ((0xf51U >> (bVar5 & 0x1f) & 1) == 0)) {
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    uVar14 = (ulong)((pmVar10->raw_component_vecsize + V2) *
                     *(int *)(&DAT_001c2630 + (ulong)bVar5 * 4) >> 3);
LAB_0016e014:
    bVar4 = false;
    local_6c = 0;
    uVar13 = 1;
LAB_0016e01c:
    Converter::Impl::add(impl,this,false);
  }
  else {
    if (IVar8 != 0) {
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      this = Converter::Impl::allocate(impl,OpCompositeExtract,IVar8);
      Operation::add_id(this,pmVar10->index_offset_id);
      Operation::add_literal(this,1);
      uVar14 = 4;
      goto LAB_0016e014;
    }
    bVar4 = get_image_dimensions_query_size(impl,builder,local_70,(uint32_t *)(local_5c + 8));
    if (!bVar4) {
      return false;
    }
    bVar4 = spv::Builder::isStorageImageType(builder,IVar7);
    bVar6 = spv::Builder::isMultisampledImageType(builder,IVar7);
    local_6c = (undefined4)CONCAT71(extraout_var,bVar6);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pIVar2 = (builder->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[IVar7];
      if (pIVar2->opCode != OpTypeImage) {
        __assert_fail("isImageType(typeId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                      ,0xd2,"Dim spv::Builder::getTypeDimensionality(Id) const");
      }
      bVar4 = !bVar6 && *(int *)(*(long *)&(pIVar2->operands).
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data + 4) != 5;
    }
    uVar13 = 0;
    IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
    local_68 = (Operation *)CONCAT44(local_68._4_4_,local_5c._8_4_);
    if (Function < (uint)local_5c._8_4_) {
      IVar8 = spv::Builder::makeVectorType(builder,IVar8,local_5c._8_4_);
    }
    if ((local_48->access_mask & 7) != 0) {
      this = Converter::Impl::allocate(impl,OpImageQuerySize - bVar4,IVar8);
      Operation::add_id(this,local_70);
      uVar14 = 4;
      if (bVar4 != false) {
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)local_5c._12_8_,2);
        IVar8 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
        Operation::add_id(this,IVar8);
      }
      uVar13 = (uint)local_68;
      goto LAB_0016e01c;
    }
    uVar14 = 4;
    this = (Operation *)0x0;
  }
  if (pmVar10->kind == StructuredBuffer) {
    IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
    local_68 = Converter::Impl::allocate(impl,OpUDiv,IVar8);
    if ((pmVar10->index_offset_id == 0) || (pmVar10->aliased == false)) {
      local_5c._0_4_ = this->id;
      uVar1 = pmVar10->stride;
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      local_5c._4_4_ = spv::Builder::makeIntConstant(builder,IVar8,(uint)(uVar1 / uVar14),false);
      this = local_68;
    }
    else {
      local_5c._0_4_ = this->id;
      uVar1 = pmVar10->stride;
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      local_5c._4_4_ = spv::Builder::makeIntConstant(builder,IVar8,uVar1,false);
      this = local_68;
    }
LAB_0016e15a:
    local_40._M_array = (iterator)local_5c;
    local_40._M_len = 2;
    Operation::add_ids(this,&local_40);
    Converter::Impl::add(impl,this,false);
  }
  else if (pmVar10->kind == RawBuffer) {
    IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
    pOVar11 = Converter::Impl::allocate(impl,OpIMul,IVar8);
    local_5c._0_4_ = this->id;
    IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
    local_5c._4_4_ = spv::Builder::makeIntConstant(builder,IVar8,(uint)uVar14,false);
    this = pOVar11;
    goto LAB_0016e15a;
  }
  pmVar3 = local_48;
  if ((local_48->access_mask & 8) == 0) {
LAB_0016e17b:
    pOVar11 = (Operation *)0x0;
  }
  else {
    if (bVar4 == false) {
      if ((char)local_6c == '\0') goto LAB_0016e17b;
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      op = OpImageQuerySamples;
    }
    else {
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      op = OpImageQueryLevels;
    }
    pOVar11 = Converter::Impl::allocate(impl,op,IVar8);
    Operation::add_id(pOVar11,local_70);
    Converter::Impl::add(impl,pOVar11,false);
  }
  if (this == (Operation *)0x0 && pOVar11 == (Operation *)0x0) {
    __assert_fail("aux_op || dimensions_op",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_sampling.cpp"
                  ,0x40e,
                  "bool dxil_spv::emit_get_dimensions_instruction(Converter::Impl &, const LLVMBC::CallInst *)"
                 );
  }
  if (pOVar11 == (Operation *)0x0 && this != (Operation *)0x0) {
    if (uVar13 == 1) {
      pmVar3->forced_composite = false;
    }
    IVar8 = this->id;
  }
  else {
    if (this != (Operation *)0x0) {
      IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
      IVar8 = spv::Builder::makeVectorType(builder,IVar8,4);
      this_00 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)local_5c._12_8_,IVar8);
      Operation::add_id(this_00,this->id);
      if (uVar13 < 3) {
        iVar12 = uVar13 - 3;
        do {
          IVar8 = spv::Builder::makeIntegerType(builder,0x20,false);
          IVar8 = spv::Builder::createUndefined(builder,IVar8);
          Operation::add_id(this_00,IVar8);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
      }
      Operation::add_id(this_00,pOVar11->id);
      Converter::Impl::add(impl,this_00,false);
      goto LAB_0016e30f;
    }
    pmVar3->forced_composite = false;
    pmVar3->access_mask = 1;
    pmVar3->components = 1;
    IVar8 = pOVar11->id;
  }
  Converter::Impl::rewrite_value(impl,(Value *)local_5c._12_8_,IVar8);
LAB_0016e30f:
  local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,0x32);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&builder->capabilities,(Capability *)&local_40);
  return true;
}

Assistant:

bool emit_get_dimensions_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t ssbo_element_size = 4;

	Operation *dimensions_op = nullptr;
	auto &access_meta = impl.llvm_composite_meta[instruction];
	uint32_t num_coords = 0;
	bool has_samples = false;
	bool has_lod = false;

	if (meta.storage == spv::StorageClassStorageBuffer)
	{
		if (meta.index_offset_id)
		{
			dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			dimensions_op->add_id(meta.index_offset_id);
			dimensions_op->add_literal(1);
		}
		else
		{
			dimensions_op = impl.allocate(spv::OpArrayLength, builder.makeUintType(32));
			dimensions_op->add_id(image_id);
			dimensions_op->add_literal(0);
		}

		ssbo_element_size = raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
		                    raw_component_type_to_bits(meta.component_type) / 8;

		impl.add(dimensions_op);
		num_coords = 1;
	}
	else if (meta.index_offset_id)
	{
		dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
		dimensions_op->add_id(meta.index_offset_id);
		dimensions_op->add_literal(1);
		impl.add(dimensions_op);
		num_coords = 1;
	}
	else
	{
		if (!get_image_dimensions_query_size(impl, builder, image_id, &num_coords))
			return false;

		bool is_uav = builder.isStorageImageType(image_type_id);
		has_samples = builder.isMultisampledImageType(image_type_id);
		has_lod = !is_uav && builder.getTypeDimensionality(image_type_id) != spv::DimBuffer && !has_samples;

		spv::Id dim_type_id = builder.makeUintType(32);
		if (num_coords > 1)
			dim_type_id = builder.makeVectorType(dim_type_id, num_coords);

		if ((access_meta.access_mask & 7) != 0)
		{
			dimensions_op = impl.allocate(has_lod ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize, dim_type_id);
			dimensions_op->add_id(image_id);
			if (has_lod)
				dimensions_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
			impl.add(dimensions_op);
		}
		else
			num_coords = 0;
	}

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		Operation *byte_size_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		byte_size_op->add_ids({ dimensions_op->id, builder.makeUintConstant(ssbo_element_size) });
		impl.add(byte_size_op);
		dimensions_op = byte_size_op;
	}
	else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
	{
		Operation *elem_count_op = impl.allocate(spv::OpUDiv, builder.makeUintType(32));

		if (meta.index_offset_id != 0)
		{
			// If the offset buffer is pre-shifted, shift the divider as well.
			if (!meta.aliased)
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });
			else
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride) });
		}
		else
			elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });

		impl.add(elem_count_op);
		dimensions_op = elem_count_op;
	}

	Operation *aux_op = nullptr;
	if ((access_meta.access_mask & (1u << 3)) != 0)
	{
		if (has_lod)
		{
			aux_op = impl.allocate(spv::OpImageQueryLevels, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
		else if (has_samples)
		{
			aux_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
	}

	assert(aux_op || dimensions_op);

	if (!aux_op && dimensions_op)
	{
		if (num_coords == 1)
			access_meta.forced_composite = false;
		impl.rewrite_value(instruction, dimensions_op->id);
	}
	else if (dimensions_op)
	{
		Operation *op =
		    impl.allocate(spv::OpCompositeConstruct, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(dimensions_op->id);

		// This element cannot be statically accessed if we don't have LOD, so don't bother returning anything here.
		// Otherwise, we need to pad out.
		for (unsigned i = num_coords; i < 3; i++)
			op->add_id(builder.createUndefined(builder.makeUintType(32)));
		op->add_id(aux_op->id);

		impl.add(op);
	}
	else
	{
		// Redirect any extract from this scalar to be preserved as-is.
		// Pretend this is a scalar even if Levels/Samples query is supposed to live in W.
		access_meta.forced_composite = false;
		access_meta.access_mask = 1;
		access_meta.components = 1;
		impl.rewrite_value(instruction, aux_op->id);
	}

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}